

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O2

void Abc_NtkQbf(Abc_Ntk_t *pNtk,int nPars,int nItersMax,int fDumpCnf,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p;
  Vec_Int_t *pVVar5;
  void *pvVar6;
  Vec_Int_t *vForAlls;
  Vec_Int_t *vExists;
  char *pcVar7;
  time_t tVar8;
  Abc_Ntk_t *pNtk_00;
  abctime aVar9;
  abctime aVar10;
  Abc_Ntk_t *pAVar11;
  Abc_Ntk_t *pAVar12;
  ulong uVar13;
  ulong uVar14;
  int i;
  Vec_Int_t *p_00;
  int i_00;
  uint uVar15;
  int iVar16;
  
  aVar4 = Abc_Clock();
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    if (pNtk->nObjCounts[8] == 0) {
      if (pNtk->vPos->nSize == 1) {
        if ((0 < nPars) && (iVar16 = pNtk->vPis->nSize, nPars < iVar16)) {
          if (fDumpCnf != 0) {
            pAig = Abc_NtkToDar(pNtk,0,0);
            p = Cnf_Derive(pAig,0);
            pVVar5 = Vec_IntStart(p->nVars);
            for (iVar16 = 0; iVar16 < pAig->vCis->nSize; iVar16 = iVar16 + 1) {
              pvVar6 = Vec_PtrEntry(pAig->vCis,iVar16);
              if (iVar16 < nPars) {
                Vec_IntWriteEntry(pVVar5,p->pVarNums[*(int *)((long)pvVar6 + 0x24)],1);
              }
            }
            vForAlls = Vec_IntAlloc(nPars);
            vExists = Vec_IntAlloc(pNtk->vPis->nSize - nPars);
            iVar16 = pVVar5->nSize;
            i_00 = 0;
            if (iVar16 < 1) {
              iVar16 = 0;
              i_00 = 0;
            }
            for (; iVar16 != i_00; i_00 = i_00 + 1) {
              iVar1 = Vec_IntEntry(pVVar5,i_00);
              p_00 = vForAlls;
              if (iVar1 == 0) {
                p_00 = vExists;
              }
              Vec_IntPush(p_00,i_00);
            }
            pcVar7 = Extra_FileNameGenericAppend(pNtk->pSpec,".qdimacs");
            Cnf_DataWriteIntoFile(p,pcVar7,0,vForAlls,vExists);
            Aig_ManStop(pAig);
            Cnf_DataFree(p);
            Vec_IntFree(vForAlls);
            Vec_IntFree(vExists);
            Vec_IntFree(pVVar5);
            printf("The 2QBF formula was written into file \"%s\".\n",pcVar7);
            return;
          }
          pVVar5 = Vec_IntStart(iVar16);
          tVar8 = time((time_t *)0x0);
          srand((uint)tVar8);
          for (iVar16 = nPars; iVar16 < pNtk->vPis->nSize; iVar16 = iVar16 + 1) {
            uVar2 = rand();
            Vec_IntWriteEntry(pVVar5,iVar16,uVar2 & 1);
          }
          Abc_NtkVectorClearPars(pVVar5,nPars);
          pNtk_00 = Abc_NtkMiterCofactor(pNtk,pVVar5);
          if (fVerbose != 0) {
            printf("Iter %2d : ",0);
            printf("AIG = %6d  ",(ulong)(uint)pNtk_00->nObjCounts[7]);
            Abc_NtkVectorPrintVars(pNtk,pVVar5,nPars);
            putchar(10);
          }
          uVar2 = 0;
          if (0 < nItersMax) {
            uVar2 = nItersMax;
          }
          uVar15 = 0;
          do {
            uVar3 = uVar2;
            if (uVar15 == uVar2) {
LAB_002aacb0:
              Abc_NtkDelete(pNtk_00);
              if (uVar3 == nItersMax) {
                pcVar7 = "Quit after %d iterations.  ";
                uVar15 = nItersMax;
LAB_002aacc9:
                printf(pcVar7,(ulong)uVar15);
                iVar16 = (int)pcVar7;
              }
              else {
                iVar16 = 0x7a98e0;
                printf("Implementation does not exist.  ");
              }
              Abc_Print(iVar16,"%s =","Total runtime");
              aVar9 = Abc_Clock();
              Abc_Print(iVar16,"%9.2f sec\n",(double)(aVar9 - aVar4) / 1000000.0);
              Vec_IntFree(pVVar5);
              return;
            }
            aVar9 = Abc_Clock();
            iVar16 = Abc_NtkDSat(pNtk_00,0,0,0,0,0,1,0,0,0);
            aVar10 = Abc_Clock();
            uVar3 = uVar15;
            if (iVar16 != 0) {
              if (iVar16 == -1) {
                pcVar7 = "Synthesis timed out.";
LAB_002aac9d:
                puts(pcVar7);
              }
              else if (iVar16 != 1) goto LAB_002aaa8d;
              goto LAB_002aacb0;
            }
            Abc_NtkModelToVector(pNtk_00,pVVar5);
LAB_002aaa8d:
            for (iVar16 = nPars; iVar16 < pNtk->vPis->nSize; iVar16 = iVar16 + 1) {
              Vec_IntWriteEntry(pVVar5,iVar16,-1);
            }
            pAVar11 = Abc_NtkMiterCofactor(pNtk,pVVar5);
            pvVar6 = Vec_PtrEntry(pAVar11->vPos,0);
            *(byte *)((long)pvVar6 + 0x15) = *(byte *)((long)pvVar6 + 0x15) ^ 4;
            Abc_Clock();
            iVar16 = Abc_NtkMiterSat(pAVar11,0,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
            Abc_Clock();
            if (iVar16 != 0) {
              Abc_NtkDelete(pAVar11);
              if (iVar16 == -1) {
                pcVar7 = "Verification timed out.";
                goto LAB_002aac9d;
              }
              if (iVar16 != 1) goto LAB_002aab22;
              Abc_NtkDelete(pNtk_00);
              uVar14 = 0;
              uVar13 = (ulong)(uint)pVVar5->nSize;
              if (pVVar5->nSize < 1) {
                uVar13 = uVar14;
              }
              uVar2 = 0;
              for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
                uVar2 = uVar2 + (pVVar5->pArray[uVar14] == 0);
              }
              printf("Parameters: ");
              for (iVar16 = 0; nPars != iVar16; iVar16 = iVar16 + 1) {
                uVar3 = Vec_IntEntry(pVVar5,iVar16);
                printf("%d",(ulong)uVar3);
              }
              printf("  Statistics: 0=%d 1=%d\n",(ulong)uVar2,(ulong)(pVVar5->nSize - uVar2));
              pcVar7 = "Solved after %d iterations.  ";
              goto LAB_002aacc9;
            }
            Abc_NtkModelToVector(pAVar11,pVVar5);
            Abc_NtkDelete(pAVar11);
LAB_002aab22:
            Abc_NtkVectorClearPars(pVVar5,nPars);
            pAVar11 = Abc_NtkMiterCofactor(pNtk,pVVar5);
            pAVar12 = Abc_NtkMiterAnd(pNtk_00,pAVar11,0,0);
            Abc_NtkDelete(pAVar11);
            Abc_NtkDelete(pNtk_00);
            uVar15 = uVar15 + 1;
            pNtk_00 = pAVar12;
            if (fVerbose != 0) {
              printf("Iter %2d : ",(ulong)uVar15);
              printf("AIG = %6d  ",(ulong)(uint)pAVar12->nObjCounts[7]);
              Abc_NtkVectorPrintVars(pNtk,pVVar5,nPars);
              iVar16 = 0x7bfa5a;
              printf("  ");
              Abc_Print(iVar16,"%s =","Syn");
              Abc_Print(iVar16,"%9.2f sec\n",(double)(aVar10 - aVar9) / 1000000.0);
            }
          } while( true );
        }
        pcVar7 = "nPars > 0 && nPars < Abc_NtkPiNum(pNtk)";
        uVar2 = 0x4a;
      }
      else {
        pcVar7 = "Abc_NtkPoNum(pNtk) == 1";
        uVar2 = 0x49;
      }
    }
    else {
      pcVar7 = "Abc_NtkIsComb(pNtk)";
      uVar2 = 0x48;
    }
  }
  else {
    pcVar7 = "Abc_NtkIsStrash(pNtk)";
    uVar2 = 0x47;
  }
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcQbf.c"
                ,uVar2,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
}

Assistant:

void Abc_NtkQbf( Abc_Ntk_t * pNtk, int nPars, int nItersMax, int fDumpCnf, int fVerbose )
{
    Abc_Ntk_t * pNtkVer, * pNtkSyn, * pNtkSyn2, * pNtkTemp;
    Vec_Int_t * vPiValues;
    abctime clkTotal = Abc_Clock(), clkS, clkV;
    int nIters, nInputs, RetValue, fFound = 0;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkIsComb(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    assert( nPars > 0 && nPars < Abc_NtkPiNum(pNtk) );
//    assert( Abc_NtkPiNum(pNtk)-nPars < 32 );
    nInputs = Abc_NtkPiNum(pNtk) - nPars;

    if ( fDumpCnf )
    {
        // original problem: \exists p \forall x \exists y.  M(p,x,y)
        // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pMan = Abc_NtkToDar( pNtk, 0, 0 );
        Cnf_Dat_t * pCnf = Cnf_Derive( pMan, 0 );
        Vec_Int_t * vVarMap, * vForAlls, * vExists;
        Aig_Obj_t * pObj;
        char * pFileName;
        int i, Entry;
        // create var map
        vVarMap = Vec_IntStart( pCnf->nVars );
        Aig_ManForEachCi( pMan, pObj, i )
            if ( i < nPars )
                Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        // create various maps
        vForAlls = Vec_IntAlloc( nPars );
        vExists = Vec_IntAlloc( Abc_NtkPiNum(pNtk) - nPars );
        Vec_IntForEachEntry( vVarMap, Entry, i )
            if ( Entry )
                Vec_IntPush( vForAlls, i );
            else
                Vec_IntPush( vExists, i );
        // generate CNF
        pFileName = Extra_FileNameGenericAppend( pNtk->pSpec, ".qdimacs" );
        Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
        Aig_ManStop( pMan );
        Cnf_DataFree( pCnf );
        Vec_IntFree( vForAlls );
        Vec_IntFree( vExists );
        Vec_IntFree( vVarMap );
        printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
        return;
    }

    // initialize the synthesized network with 0000-combination
    vPiValues = Vec_IntStart( Abc_NtkPiNum(pNtk) );

    // create random init value
    {
    int i;
    srand( time(NULL) );
    for ( i = nPars; i < Abc_NtkPiNum(pNtk); i++ )
        Vec_IntWriteEntry( vPiValues, i, rand() & 1 );
    }

    Abc_NtkVectorClearPars( vPiValues, nPars );
    pNtkSyn = Abc_NtkMiterCofactor( pNtk, vPiValues );
    if ( fVerbose )
    {
        printf( "Iter %2d : ", 0 );
        printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
        Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
        printf( "\n" );
    }

    // iteratively solve
    for ( nIters = 0; nIters < nItersMax; nIters++ )
    {
        // solve the synthesis instance
clkS = Abc_Clock();
//        RetValue = Abc_NtkMiterSat( pNtkSyn, 0, 0, 0, NULL, NULL );
        RetValue = Abc_NtkDSat( pNtkSyn, (ABC_INT64_T)0, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
clkS = Abc_Clock() - clkS;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkSyn, vPiValues );
        if ( RetValue == 1 )
        {
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Synthesis timed out.\n" );
            break;
        }
        // there is a counter-example

        // construct the verification instance
        Abc_NtkVectorClearVars( pNtk, vPiValues, nPars );
        pNtkVer = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // complement the output
        Abc_ObjXorFaninC( Abc_NtkPo(pNtkVer,0), 0 );

        // solve the verification instance
clkV = Abc_Clock();
        RetValue = Abc_NtkMiterSat( pNtkVer, 0, 0, 0, NULL, NULL );
clkV = Abc_Clock() - clkV;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkVer, vPiValues );
        Abc_NtkDelete( pNtkVer );
        if ( RetValue == 1 )
        {
            fFound = 1;
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Verification timed out.\n" );
            break;
        }
        // there is a counter-example

        // create a new synthesis network
        Abc_NtkVectorClearPars( vPiValues, nPars );
        pNtkSyn2 = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // add to the synthesis instance
        pNtkSyn = Abc_NtkMiterAnd( pNtkTemp = pNtkSyn, pNtkSyn2, 0, 0 );
        Abc_NtkDelete( pNtkSyn2 );
        Abc_NtkDelete( pNtkTemp );

        if ( fVerbose )
        {
            printf( "Iter %2d : ", nIters+1 );
            printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
            Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
            printf( "  " );
            ABC_PRT( "Syn", clkS );
//            ABC_PRT( "Ver", clkV );
        }
    }
    Abc_NtkDelete( pNtkSyn );
    // report the results
    if ( fFound )
    {
        int nZeros = Vec_IntCountZero( vPiValues );
        printf( "Parameters: " );
        Abc_NtkVectorPrintPars( vPiValues, nPars );
        printf( "  Statistics: 0=%d 1=%d\n", nZeros, Vec_IntSize(vPiValues) - nZeros );
        printf( "Solved after %d iterations.  ", nIters );
    }
    else if ( nIters == nItersMax )
        printf( "Quit after %d iterations.  ", nItersMax );
    else
        printf( "Implementation does not exist.  " );
    ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
    Vec_IntFree( vPiValues );
}